

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Face.cpp
# Opt level: O3

shared_ptr<Face> __thiscall Face::get_sending_neighbor(Face *this,Corner corner,Direction dir)

{
  long lVar1;
  int in_ECX;
  Direction dir_00;
  undefined4 in_register_00000034;
  shared_ptr<Face> sVar2;
  shared_ptr<Face> sVar3;
  
  switch(dir) {
  case clockwise:
    if (in_ECX == 0) {
      *(undefined8 *)this = *(undefined8 *)(CONCAT44(in_register_00000034,corner) + 0x108);
      lVar1 = *(long *)(CONCAT44(in_register_00000034,corner) + 0x110);
    }
    else {
      *(undefined8 *)this = *(undefined8 *)(CONCAT44(in_register_00000034,corner) + 0xf8);
      lVar1 = *(long *)(CONCAT44(in_register_00000034,corner) + 0x100);
    }
    break;
  case counterclockwise:
    if (in_ECX == 0) {
      *(undefined8 *)this = *(undefined8 *)(CONCAT44(in_register_00000034,corner) + 0x128);
      lVar1 = *(long *)(CONCAT44(in_register_00000034,corner) + 0x130);
    }
    else {
      *(undefined8 *)this = *(undefined8 *)(CONCAT44(in_register_00000034,corner) + 0x118);
      lVar1 = *(long *)(CONCAT44(in_register_00000034,corner) + 0x120);
    }
    break;
  case 2:
    if (in_ECX == 0) {
      *(undefined8 *)this = *(undefined8 *)(CONCAT44(in_register_00000034,corner) + 0x148);
      lVar1 = *(long *)(CONCAT44(in_register_00000034,corner) + 0x150);
    }
    else {
      *(undefined8 *)this = *(undefined8 *)(CONCAT44(in_register_00000034,corner) + 0x138);
      lVar1 = *(long *)(CONCAT44(in_register_00000034,corner) + 0x140);
    }
    break;
  case 3:
    if (in_ECX == 0) {
      *(undefined8 *)this = *(undefined8 *)(CONCAT44(in_register_00000034,corner) + 0x168);
      lVar1 = *(long *)(CONCAT44(in_register_00000034,corner) + 0x170);
    }
    else {
      *(undefined8 *)this = *(undefined8 *)(CONCAT44(in_register_00000034,corner) + 0x158);
      lVar1 = *(long *)(CONCAT44(in_register_00000034,corner) + 0x160);
    }
    break;
  default:
    get_sending_neighbor();
    sVar3 = get_sending_neighbor(this,corner,dir_00);
    sVar3.super___shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
    return (shared_ptr<Face>)sVar3.super___shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2>;
  }
  *(long *)&(this->current_state)._M_t._M_impl = lVar1;
  if (lVar1 != 0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)(lVar1 + 8) = *(int *)(lVar1 + 8) + 1;
      UNLOCK();
    }
    else {
      *(int *)(lVar1 + 8) = *(int *)(lVar1 + 8) + 1;
    }
  }
  sVar2.super___shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&switchD_00106d25::switchdataD_001084c0;
  sVar2.super___shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (shared_ptr<Face>)sVar2.super___shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Face> Face::get_sending_neighbor(Corner corner, Direction dir){
    switch (corner)
    {
    case Corner::U:
        if(dir == Direction::clockwise){
            return neighbors.U_neighbor_right;
        }
        else{
            return neighbors.U_neighbor_left;
        }
        break;
    case Corner::L:
        if(dir == Direction::clockwise){
            return neighbors.L_neighbor_right;
        }
        else{
            return neighbors.L_neighbor_left;
        }
        break;
    case Corner::R:
        if(dir == Direction::clockwise){
            return neighbors.R_neighbor_right;
        }
        else{
            return neighbors.R_neighbor_left;
        }
        break;
    case Corner::B:
        if(dir == Direction::clockwise){
            return neighbors.B_neighbor_right;
        }
        else{
            return neighbors.B_neighbor_left;
        }
        break;
    default:
        printf("Invalid move specified");
        break;
    }
}